

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O0

void jpeg_idct_9x9(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long in_RCX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  JLONG z4;
  JLONG z3;
  JLONG z2;
  JLONG z1;
  JLONG tmp14;
  JLONG tmp13;
  JLONG tmp12;
  JLONG tmp11;
  JLONG tmp10;
  JLONG tmp3;
  JLONG tmp2;
  JLONG tmp1;
  JLONG tmp0;
  int local_1e8 [16];
  int local_1a8 [8];
  int local_188 [8];
  int local_168 [8];
  int local_148 [8];
  int local_128 [8];
  int local_108 [8];
  int local_e8 [11];
  int local_bc;
  long local_b8;
  int *local_a8;
  short *local_a0;
  short *local_98;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  uint local_24;
  long local_20;
  
  local_b8 = *(long *)(in_RDI + 0x1a8) + 0x80;
  local_a0 = *(short **)(in_RSI + 0x58);
  local_a8 = local_1e8;
  local_98 = in_RDX;
  local_24 = in_R8D;
  local_20 = in_RCX;
  for (local_bc = 0; local_bc < 8; local_bc = local_bc + 1) {
    lVar1 = (long)((int)*local_98 * (int)*local_a0) * 0x2000 + 0x400;
    lVar2 = (long)((int)local_98[0x10] * (int)local_a0[0x10]);
    lVar3 = (long)((int)local_98[0x20] * (int)local_a0[0x20]);
    lVar4 = (long)((int)local_98[0x30] * (int)local_a0[0x30]);
    lVar5 = lVar1 + lVar4 * 0x16a1;
    lVar1 = lVar1 + lVar4 * -0x16a1 + lVar4 * -0x16a1;
    lVar4 = lVar2 - lVar3;
    local_58 = lVar1 + lVar4 * 0x16a1;
    local_70 = lVar1 + lVar4 * -0x16a1 + lVar4 * -0x16a1;
    local_50 = lVar5 + (lVar2 + lVar3) * 0x2a87 + lVar3 * -0x7dc;
    local_60 = lVar5 + (lVar2 + lVar3) * -0x2a87 + lVar2 * 0x22ab;
    local_68 = lVar5 + lVar2 * -0x22ab + lVar3 * 0x7dc;
    lVar1 = (long)((int)local_98[8] * (int)local_a0[8]);
    lVar2 = (long)((int)local_98[0x28] * (int)local_a0[0x28]);
    lVar3 = (long)((int)local_98[0x38] * (int)local_a0[0x38]);
    lVar4 = (long)((int)local_98[0x18] * (int)local_a0[0x18]) * -0x2731;
    local_40 = (lVar1 + lVar2) * 0x1d17;
    local_48 = (lVar1 + lVar3) * 0xf7a;
    local_30 = local_40 + local_48 + (long)((int)local_98[0x18] * (int)local_a0[0x18]) * 0x2731;
    local_40 = lVar4 + (lVar2 - lVar3) * -0x2c91 + local_40;
    local_48 = lVar4 + (lVar2 - lVar3) * 0x2c91 + local_48;
    local_38 = ((lVar1 - lVar2) - lVar3) * 0x2731;
    *local_a8 = (int)(local_50 + local_30 >> 0xb);
    local_a8[0x40] = (int)(local_50 - local_30 >> 0xb);
    local_a8[8] = (int)(local_58 + local_38 >> 0xb);
    local_a8[0x38] = (int)(local_58 - local_38 >> 0xb);
    local_a8[0x10] = (int)(local_60 + local_40 >> 0xb);
    local_a8[0x30] = (int)(local_60 - local_40 >> 0xb);
    local_a8[0x18] = (int)(local_68 + local_48 >> 0xb);
    local_a8[0x28] = (int)(local_68 - local_48 >> 0xb);
    local_a8[0x20] = (int)(local_70 >> 0xb);
    local_98 = local_98 + 1;
    local_a0 = local_a0 + 1;
    local_a8 = local_a8 + 1;
  }
  local_a8 = local_1e8;
  for (local_bc = 0; local_bc < 9; local_bc = local_bc + 1) {
    puVar6 = (undefined1 *)(*(long *)(local_20 + (long)local_bc * 8) + (ulong)local_24);
    lVar1 = ((long)*local_a8 + 0x10) * 0x2000;
    lVar2 = (long)local_a8[2];
    lVar3 = (long)local_a8[4];
    lVar4 = (long)local_a8[6];
    lVar5 = lVar1 + lVar4 * 0x16a1;
    lVar1 = lVar1 + lVar4 * -0x16a1 + lVar4 * -0x16a1;
    lVar4 = lVar2 - lVar3;
    lVar7 = lVar1 + lVar4 * 0x16a1;
    lVar8 = lVar5 + (lVar2 + lVar3) * 0x2a87 + lVar3 * -0x7dc;
    lVar9 = lVar5 + (lVar2 + lVar3) * -0x2a87 + lVar2 * 0x22ab;
    lVar2 = lVar5 + lVar2 * -0x22ab + lVar3 * 0x7dc;
    lVar3 = (long)local_a8[1];
    lVar5 = (long)local_a8[5];
    lVar10 = (long)local_a8[7];
    lVar11 = (long)local_a8[3] * -0x2731;
    lVar12 = (lVar3 + lVar5) * 0x1d17;
    lVar13 = (lVar3 + lVar10) * 0xf7a;
    lVar14 = lVar12 + lVar13 + (long)local_a8[3] * 0x2731;
    lVar12 = lVar11 + (lVar5 - lVar10) * -0x2c91 + lVar12;
    lVar13 = lVar11 + (lVar5 - lVar10) * 0x2c91 + lVar13;
    lVar10 = (lVar3 - lVar5) - lVar10;
    *puVar6 = *(undefined1 *)(local_b8 + (int)((uint)(lVar8 + lVar14 >> 0x12) & 0x3ff));
    puVar6[8] = *(undefined1 *)(local_b8 + (int)((uint)(lVar8 - lVar14 >> 0x12) & 0x3ff));
    puVar6[1] = *(undefined1 *)(local_b8 + (int)((uint)(lVar7 + lVar10 * 0x2731 >> 0x12) & 0x3ff));
    puVar6[7] = *(undefined1 *)(local_b8 + (int)((uint)(lVar7 + lVar10 * -0x2731 >> 0x12) & 0x3ff));
    puVar6[2] = *(undefined1 *)(local_b8 + (int)((uint)(lVar9 + lVar12 >> 0x12) & 0x3ff));
    puVar6[6] = *(undefined1 *)(local_b8 + (int)((uint)(lVar9 - lVar12 >> 0x12) & 0x3ff));
    puVar6[3] = *(undefined1 *)(local_b8 + (int)((uint)(lVar2 + lVar13 >> 0x12) & 0x3ff));
    puVar6[5] = *(undefined1 *)(local_b8 + (int)((uint)(lVar2 - lVar13 >> 0x12) & 0x3ff));
    puVar6[4] = *(undefined1 *)
                 (local_b8 +
                 (int)((uint)(lVar1 + lVar4 * -0x16a1 + lVar4 * -0x16a1 >> 0x12) & 0x3ff));
    local_a8 = local_a8 + 8;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_9x9(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JCOEFPTR coef_block, JSAMPARRAY output_buf,
              JDIMENSION output_col)
{
  JLONG tmp0, tmp1, tmp2, tmp3, tmp10, tmp11, tmp12, tmp13, tmp14;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 9];         /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS);
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS - PASS1_BITS - 1);

    z1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    tmp3 = MULTIPLY(z3, FIX(0.707106781));      /* c6 */
    tmp1 = tmp0 + tmp3;
    tmp2 = tmp0 - tmp3 - tmp3;

    tmp0 = MULTIPLY(z1 - z2, FIX(0.707106781)); /* c6 */
    tmp11 = tmp2 + tmp0;
    tmp14 = tmp2 - tmp0 - tmp0;

    tmp0 = MULTIPLY(z1 + z2, FIX(1.328926049)); /* c2 */
    tmp2 = MULTIPLY(z1, FIX(1.083350441));      /* c4 */
    tmp3 = MULTIPLY(z2, FIX(0.245575608));      /* c8 */

    tmp10 = tmp1 + tmp0 - tmp3;
    tmp12 = tmp1 - tmp0 + tmp2;
    tmp13 = tmp1 - tmp2 + tmp3;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    z2 = MULTIPLY(z2, -FIX(1.224744871));            /* -c3 */

    tmp2 = MULTIPLY(z1 + z3, FIX(0.909038955));      /* c5 */
    tmp3 = MULTIPLY(z1 + z4, FIX(0.483689525));      /* c7 */
    tmp0 = tmp2 + tmp3 - z2;
    tmp1 = MULTIPLY(z3 - z4, FIX(1.392728481));      /* c1 */
    tmp2 += z2 - tmp1;
    tmp3 += z2 + tmp1;
    tmp1 = MULTIPLY(z1 - z3 - z4, FIX(1.224744871)); /* c3 */

    /* Final output stage */

    wsptr[8 * 0] = (int)RIGHT_SHIFT(tmp10 + tmp0, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8] = (int)RIGHT_SHIFT(tmp10 - tmp0, CONST_BITS - PASS1_BITS);
    wsptr[8 * 1] = (int)RIGHT_SHIFT(tmp11 + tmp1, CONST_BITS - PASS1_BITS);
    wsptr[8 * 7] = (int)RIGHT_SHIFT(tmp11 - tmp1, CONST_BITS - PASS1_BITS);
    wsptr[8 * 2] = (int)RIGHT_SHIFT(tmp12 + tmp2, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6] = (int)RIGHT_SHIFT(tmp12 - tmp2, CONST_BITS - PASS1_BITS);
    wsptr[8 * 3] = (int)RIGHT_SHIFT(tmp13 + tmp3, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5] = (int)RIGHT_SHIFT(tmp13 - tmp3, CONST_BITS - PASS1_BITS);
    wsptr[8 * 4] = (int)RIGHT_SHIFT(tmp14, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 9 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 9; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS);

    z1 = (JLONG)wsptr[2];
    z2 = (JLONG)wsptr[4];
    z3 = (JLONG)wsptr[6];

    tmp3 = MULTIPLY(z3, FIX(0.707106781));      /* c6 */
    tmp1 = tmp0 + tmp3;
    tmp2 = tmp0 - tmp3 - tmp3;

    tmp0 = MULTIPLY(z1 - z2, FIX(0.707106781)); /* c6 */
    tmp11 = tmp2 + tmp0;
    tmp14 = tmp2 - tmp0 - tmp0;

    tmp0 = MULTIPLY(z1 + z2, FIX(1.328926049)); /* c2 */
    tmp2 = MULTIPLY(z1, FIX(1.083350441));      /* c4 */
    tmp3 = MULTIPLY(z2, FIX(0.245575608));      /* c8 */

    tmp10 = tmp1 + tmp0 - tmp3;
    tmp12 = tmp1 - tmp0 + tmp2;
    tmp13 = tmp1 - tmp2 + tmp3;

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z4 = (JLONG)wsptr[7];

    z2 = MULTIPLY(z2, -FIX(1.224744871));            /* -c3 */

    tmp2 = MULTIPLY(z1 + z3, FIX(0.909038955));      /* c5 */
    tmp3 = MULTIPLY(z1 + z4, FIX(0.483689525));      /* c7 */
    tmp0 = tmp2 + tmp3 - z2;
    tmp1 = MULTIPLY(z3 - z4, FIX(1.392728481));      /* c1 */
    tmp2 += z2 - tmp1;
    tmp3 += z2 + tmp1;
    tmp1 = MULTIPLY(z1 - z3 - z4, FIX(1.224744871)); /* c3 */

    /* Final output stage */

    outptr[0] = range_limit[(int)RIGHT_SHIFT(tmp10 + tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[8] = range_limit[(int)RIGHT_SHIFT(tmp10 - tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)RIGHT_SHIFT(tmp11 + tmp1,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[7] = range_limit[(int)RIGHT_SHIFT(tmp11 - tmp1,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)RIGHT_SHIFT(tmp12 + tmp2,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[6] = range_limit[(int)RIGHT_SHIFT(tmp12 - tmp2,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[3] = range_limit[(int)RIGHT_SHIFT(tmp13 + tmp3,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[5] = range_limit[(int)RIGHT_SHIFT(tmp13 - tmp3,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[4] = range_limit[(int)RIGHT_SHIFT(tmp14,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}